

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

int __thiscall QLocale::toInt(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  int iVar2;
  long lVar3;
  QSimpleParsedNumber<long_long> QVar5;
  long lVar4;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  lVar3 = QVar5.result;
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar5.used;
  }
  lVar4 = 0;
  if ((int)QVar5.result == lVar3) {
    lVar4 = lVar3;
  }
  iVar2 = (int)lVar4;
  if ((ok != (bool *)0x0) && (lVar3 + 0x80000000U >> 0x20 != 0)) {
    *ok = false;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int QLocale::toInt(QStringView s, bool *ok) const
{
    return toIntegral_helper<int>(d, s, ok);
}